

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

Node * __thiscall State::GetNode(State *this,StringPiece path,uint64_t slash_bits)

{
  const_iterator cVar1;
  mapped_type pNVar2;
  mapped_type *ppNVar3;
  size_t sVar4;
  char *pcVar5;
  key_type local_50;
  char local_40;
  undefined7 uStack_3f;
  
  sVar4 = path.len_;
  pcVar5 = path.str_;
  local_50.str_ = pcVar5;
  local_50.len_ = sVar4;
  cVar1 = std::
          _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_50);
  if (cVar1.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur ==
      (__node_type *)0x0) {
    pNVar2 = (mapped_type)0x0;
  }
  else {
    pNVar2 = *(mapped_type *)
              ((long)cVar1.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>.
                     _M_cur + 0x18);
  }
  if (pNVar2 == (mapped_type)0x0) {
    pNVar2 = (mapped_type)operator_new(0x78);
    local_50.str_ = &local_40;
    if (sVar4 == 0) {
      local_50.len_ = 0;
      local_40 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + sVar4);
    }
    (pNVar2->path_)._M_dataplus._M_p = (pointer)&(pNVar2->path_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pNVar2,local_50.str_,local_50.str_ + local_50.len_);
    pNVar2->slash_bits_ = slash_bits;
    pNVar2->mtime_ = -1;
    pNVar2->exists_ = ExistenceStatusUnknown;
    pNVar2->dirty_ = false;
    pNVar2->dyndep_pending_ = false;
    pNVar2->in_edge_ = (Edge *)0x0;
    (pNVar2->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar2->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar2->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pNVar2->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar2->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar2->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar2->id_ = -1;
    if (local_50.str_ != &local_40) {
      operator_delete(local_50.str_,CONCAT71(uStack_3f,local_40) + 1);
    }
    local_50.str_ = (pNVar2->path_)._M_dataplus._M_p;
    local_50.len_ = (pNVar2->path_)._M_string_length;
    ppNVar3 = std::__detail::
              _Map_base<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,&local_50);
    *ppNVar3 = pNVar2;
  }
  return pNVar2;
}

Assistant:

Node* State::GetNode(StringPiece path, uint64_t slash_bits) {
  Node* node = LookupNode(path);
  if (node)
    return node;
  node = new Node(path.AsString(), slash_bits);
  paths_[node->path()] = node;
  return node;
}